

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O3

bool __thiscall Minefield::isMine(Minefield *this,int x,int y)

{
  bool bVar1;
  runtime_error *this_00;
  int iVar2;
  
  checkPos(this,x,y);
  if ((this->opened_mine == false) &&
     (this->given_mine_count < this->given_y_dimension * this->given_x_dimension - this->open_cnt))
  {
    bVar1 = isOpen(this,x,y);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t check if is mine on not-opened field.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = y + 0x3f;
  if (-1 < y) {
    iVar2 = y;
  }
  return (*(ulong *)((long)(iVar2 >> 6) * 8 +
                     *(long *)&(this->mines).
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[x].
                               super__Bvector_base<std::allocator<bool>_>._M_impl + -8 +
                    (ulong)(((long)y & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
          ((ulong)(uint)y & 0x3f) & 1) != 0;
}

Assistant:

bool Minefield::isMine(int x, int y) {
    checkPos(x, y);
    if (isGameRunning() && ! isOpen(x, y)) {
        throw std::runtime_error("Can't check if is mine on not-opened field.");
    }

    return mines[x][y];
}